

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getAttribute
          (QPDFPageObjectHelper *this,string *name,bool copy_if_shared,
          function<QPDFObjectHandle_()> *get_fallback,bool copy_if_fallback)

{
  size_t *key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000081;
  byte in_R9B;
  QPDFObjectHandle QVar3;
  bool local_1d2;
  QPDFObjectHandle local_188;
  QPDFObjectHandle local_178;
  undefined1 local_168 [32];
  QPDFObjectHandle local_148;
  QPDFObjectHandle local_138;
  allocator<char> local_121;
  string local_120 [32];
  QPDFObjectHandle local_100;
  byte local_eb;
  byte local_ea;
  allocator<char> local_e9;
  string local_e8;
  QPDFObjGen local_c8;
  undefined1 local_c0 [8];
  set seen;
  QPDFObjectHandle node;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  QPDFObjectHandle dict;
  bool inherited;
  undefined1 local_48 [30];
  bool is_form_xobject;
  bool copy_if_fallback_local;
  function<QPDFObjectHandle_()> *get_fallback_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_20;
  bool copy_if_shared_local;
  string *name_local;
  QPDFPageObjectHelper *this_local;
  QPDFObjectHandle *result;
  
  pbStack_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_register_00000011,copy_if_shared);
  get_fallback_local._7_1_ = (byte)get_fallback & 1;
  unique0x1000021b = (element_type *)CONCAT71(in_register_00000081,copy_if_fallback);
  local_48[0x17] = in_R9B & 1;
  name_local = name;
  this_local = this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_48);
  bVar2 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)local_48);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._3_1_ = 0;
  local_48[0x16] = bVar2;
  if (bVar2) {
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_78);
    QPDFObjectHandle::getDict((QPDFObjectHandle *)local_68);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
  }
  else {
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_68);
  }
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_68);
  if ((((local_48[0x16] & 1) == 0) &&
      (bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this), bVar2)) &&
     ((bVar2 = std::operator==(pbStack_20,"/MediaBox"), bVar2 ||
      (((bVar2 = std::operator==(pbStack_20,"/CropBox"), bVar2 ||
        (bVar2 = std::operator==(pbStack_20,"/Resources"), bVar2)) ||
       (bVar2 = std::operator==(pbStack_20,"/Rotate"), bVar2)))))) {
    QPDFObjectHandle::QPDFObjectHandle
              ((QPDFObjectHandle *)
               &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
                _M_impl.super__Rb_tree_header._M_node_count,(QPDFObjectHandle *)local_68);
    memset(local_c0,0,0x30);
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::set
              ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)local_c0);
    do {
      local_ea = 0;
      local_eb = 0;
      local_c8 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                           ((BaseHandle *)
                            &seen.
                             super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                             ._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar2 = QPDFObjGen::set::add((set *)local_c0,local_c8);
      local_1d2 = false;
      if (bVar2) {
        std::allocator<char>::allocator();
        local_ea = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"/Parent",&local_e9);
        local_eb = 1;
        local_1d2 = QPDFObjectHandle::hasKey
                              ((QPDFObjectHandle *)
                               &seen.
                                super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                ._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_e8);
      }
      if ((local_eb & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_e8);
      }
      if ((local_ea & 1) != 0) {
        std::allocator<char>::~allocator(&local_e9);
      }
      if (local_1d2 == false) goto LAB_002e73f7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_120,"/Parent",&local_121);
      QPDFObjectHandle::getKey
                (&local_100,
                 (string *)
                 &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                  _M_t._M_impl.super__Rb_tree_header._M_node_count);
      key = &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
             _M_impl.super__Rb_tree_header._M_node_count;
      QPDFObjectHandle::operator=((QPDFObjectHandle *)key,&local_100);
      QPDFObjectHandle::~QPDFObjectHandle(&local_100);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator(&local_121);
      QPDFObjectHandle::getKey(&local_138,(string *)key);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_138);
      QPDFObjectHandle::~QPDFObjectHandle(&local_138);
      bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
    } while (bVar2);
    QTC::TC("qpdf","QPDFPageObjectHelper non-trivial inheritance",0);
    dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._3_1_ = 1;
LAB_002e73f7:
    QPDFObjGen::set::~set((set *)local_c0);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
                _M_impl.super__Rb_tree_header._M_node_count);
  }
  if (((get_fallback_local._7_1_ & 1) != 0) &&
     (((dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._3_1_ & 1) != 0 ||
      (bVar2 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)this), bVar2)))) {
    QTC::TC("qpdf","QPDFPageObjectHelper copy shared attribute",(byte)~local_48[0x16] & 1);
    pbVar1 = pbStack_20;
    QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)(local_168 + 0x10));
    QPDFObjectHandle::replaceKeyAndGetNew(&local_148,(string *)local_68,(QPDFObjectHandle *)pbVar1);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_148);
    QPDFObjectHandle::~QPDFObjectHandle(&local_148);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_168 + 0x10));
  }
  bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
  if ((bVar2) &&
     (bVar2 = std::function::operator_cast_to_bool
                        ((function *)CONCAT71(in_register_00000081,copy_if_fallback)), bVar2)) {
    std::function<QPDFObjectHandle_()>::operator()((function<QPDFObjectHandle_()> *)local_168);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)this,(QPDFObjectHandle *)local_168);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_168);
    if (((local_48[0x17] & 1) == 0) ||
       (bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this), bVar2)) {
      QTC::TC("qpdf","QPDFPageObjectHelper used fallback without copying",0);
    }
    else {
      QTC::TC("qpdf","QPDFPageObjectHelper copied fallback",0);
      pbVar1 = pbStack_20;
      QPDFObjectHandle::shallowCopy(&local_188);
      QPDFObjectHandle::replaceKeyAndGetNew
                (&local_178,(string *)local_68,(QPDFObjectHandle *)pbVar1);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_178);
      QPDFObjectHandle::~QPDFObjectHandle(&local_178);
      QPDFObjectHandle::~QPDFObjectHandle(&local_188);
    }
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_68);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getAttribute(
    std::string const& name,
    bool copy_if_shared,
    std::function<QPDFObjectHandle()> get_fallback,
    bool copy_if_fallback)
{
    const bool is_form_xobject = oh().isFormXObject();
    bool inherited = false;
    auto dict = is_form_xobject ? oh().getDict() : oh();
    auto result = dict.getKey(name);

    if (!is_form_xobject && result.isNull() &&
        (name == "/MediaBox" || name == "/CropBox" || name == "/Resources" || name == "/Rotate")) {
        QPDFObjectHandle node = dict;
        QPDFObjGen::set seen{};
        while (seen.add(node) && node.hasKey("/Parent")) {
            node = node.getKey("/Parent");
            result = node.getKey(name);
            if (!result.isNull()) {
                QTC::TC("qpdf", "QPDFPageObjectHelper non-trivial inheritance");
                inherited = true;
                break;
            }
        }
    }
    if (copy_if_shared && (inherited || result.isIndirect())) {
        QTC::TC("qpdf", "QPDFPageObjectHelper copy shared attribute", is_form_xobject ? 0 : 1);
        result = dict.replaceKeyAndGetNew(name, result.shallowCopy());
    }
    if (result.isNull() && get_fallback) {
        result = get_fallback();
        if (copy_if_fallback && !result.isNull()) {
            QTC::TC("qpdf", "QPDFPageObjectHelper copied fallback");
            result = dict.replaceKeyAndGetNew(name, result.shallowCopy());
        } else {
            QTC::TC("qpdf", "QPDFPageObjectHelper used fallback without copying");
        }
    }
    return result;
}